

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_chicken.cpp
# Opt level: O0

PClass * __thiscall AChickenPlayer::StaticType(AChickenPlayer *this)

{
  AChickenPlayer *this_local;
  
  return RegistrationInfo.MyClass;
}

Assistant:

void AChickenPlayer::MorphPlayerThink ()
{
	if (health > 0)
	{ // Handle beak movement
		P_UpdateBeak (this);
	}
	if (player->morphTics & 15)
	{
		return;
	}
	if (Vel.X == 0 && Vel.Y == 0 && pr_chickenplayerthink () < 160)
	{ // Twitch view angle
		Angles.Yaw += pr_chickenplayerthink.Random2() * (360. / 256. / 32.);
	}
	if ((Z() <= floorz) && (pr_chickenplayerthink() < 32))
	{ // Jump and noise
		Vel.Z += JumpZ;

		FState * painstate = FindState(NAME_Pain);
		if (painstate != NULL) SetState (painstate);
	}
	if (pr_chickenplayerthink () < 48)
	{ // Just noise
		S_Sound (this, CHAN_VOICE, "chicken/active", 1, ATTN_NORM);
	}
}